

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

void writefv(FILE *f,char *fmt,__va_list_tag *v)

{
  uint uVar1;
  char *pcVar2;
  uint *in_RDX;
  char *in_RSI;
  int32 x_2;
  int16 x_1;
  uint8 x;
  int in_stack_ffffffffffffff8c;
  FILE *in_stack_ffffffffffffff90;
  char *local_10;
  
  local_10 = in_RSI;
  while (*local_10 != '\0') {
    pcVar2 = local_10 + 1;
    switch(*local_10) {
    case ' ':
      local_10 = pcVar2;
      break;
    default:
      return;
    case '1':
      if (*in_RDX < 0x29) {
        *in_RDX = *in_RDX + 8;
      }
      else {
        *(long *)(in_RDX + 2) = *(long *)(in_RDX + 2) + 8;
      }
      write8(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      local_10 = pcVar2;
      break;
    case '2':
      if (*in_RDX < 0x29) {
        *in_RDX = *in_RDX + 8;
      }
      else {
        *(long *)(in_RDX + 2) = *(long *)(in_RDX + 2) + 8;
      }
      write8(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      write8(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      local_10 = pcVar2;
      break;
    case '4':
      uVar1 = *in_RDX;
      if (uVar1 < 0x29) {
        in_stack_ffffffffffffff90 = (FILE *)((long)(int)uVar1 + *(long *)(in_RDX + 4));
        *in_RDX = uVar1 + 8;
      }
      else {
        in_stack_ffffffffffffff90 = *(FILE **)(in_RDX + 2);
        *(char ***)(in_RDX + 2) = &in_stack_ffffffffffffff90->_IO_read_ptr;
      }
      write8(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      write8(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      write8(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      write8(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      local_10 = pcVar2;
    }
  }
  return;
}

Assistant:

static void writefv(FILE *f, char *fmt, va_list v)
{
   while (*fmt) {
      switch (*fmt++) {
         case ' ': break;
         case '1': { uint8 x = va_arg(v, int); write8(f,x); break; }
         case '2': { int16 x = va_arg(v, int); write8(f,x); write8(f,x>>8); break; }
         case '4': { int32 x = va_arg(v, int); write8(f,x); write8(f,x>>8); write8(f,x>>16); write8(f,x>>24); break; }
         default:
            assert(0);
            va_end(v);
            return;
      }
   }
}